

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_basetableref.cpp
# Opt level: O2

vector<duckdb::CatalogSearchEntry,_true> * __thiscall
duckdb::Binder::GetSearchPath
          (vector<duckdb::CatalogSearchEntry,_true> *__return_storage_ptr__,Binder *this,
          Catalog *catalog,string *schema_name)

{
  bool bVar1;
  string *psVar2;
  string default_schema;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_38;
  
  (__return_storage_ptr__->
  super_vector<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>).
  super__Vector_base<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super_vector<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>).
  super__Vector_base<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super_vector<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>).
  super__Vector_base<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  psVar2 = Catalog::GetName_abi_cxx11_(catalog);
  if (schema_name->_M_string_length != 0) {
    ::std::vector<duckdb::CatalogSearchEntry,std::allocator<duckdb::CatalogSearchEntry>>::
    emplace_back<std::__cxx11::string_const&,std::__cxx11::string_const&>
              ((vector<duckdb::CatalogSearchEntry,std::allocator<duckdb::CatalogSearchEntry>> *)
               __return_storage_ptr__,psVar2,schema_name);
  }
  (*catalog->_vptr_Catalog[0x19])(&bStack_38,catalog);
  if (schema_name->_M_string_length == 0) {
    bVar1 = ::std::operator!=(schema_name,&bStack_38);
    if (bVar1) {
      psVar2 = Catalog::GetName_abi_cxx11_(catalog);
      ::std::vector<duckdb::CatalogSearchEntry,std::allocator<duckdb::CatalogSearchEntry>>::
      emplace_back<std::__cxx11::string_const&,std::__cxx11::string&>
                ((vector<duckdb::CatalogSearchEntry,std::allocator<duckdb::CatalogSearchEntry>> *)
                 __return_storage_ptr__,psVar2,&bStack_38);
    }
  }
  ::std::__cxx11::string::~string((string *)&bStack_38);
  return __return_storage_ptr__;
}

Assistant:

vector<CatalogSearchEntry> Binder::GetSearchPath(Catalog &catalog, const string &schema_name) {
	vector<CatalogSearchEntry> view_search_path;
	auto &catalog_name = catalog.GetName();
	if (!schema_name.empty()) {
		view_search_path.emplace_back(catalog_name, schema_name);
	}
	auto default_schema = catalog.GetDefaultSchema();
	if (schema_name.empty() && schema_name != default_schema) {
		view_search_path.emplace_back(catalog.GetName(), default_schema);
	}
	return view_search_path;
}